

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O3

void __thiscall
glcts::RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest::createAssets
          (RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x6f8))(1,&this->to_id);
  (**(code **)(lVar2 + 0xb8))(0x9102,this->to_id);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Texture object initialization failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0x38e);
  return;
}

Assistant:

void RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest::createAssets()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate texture object. */
	gl.genTextures(1, &to_id);

	/* Bind texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture object initialization failed.");
}